

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

string * __thiscall
duckdb::ART::VerifyAndToStringInternal_abi_cxx11_
          (string *__return_storage_ptr__,ART *this,bool only_verify)

{
  string local_30;
  
  if (*(char *)((long)&(this->tree).super_IndexPointer.data + 7) == '\0') {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"[empty]",(allocator *)&local_30);
  }
  else {
    Node::VerifyAndToString_abi_cxx11_(&local_30,&this->tree,this,only_verify);
    ::std::operator+(__return_storage_ptr__,"ART: ",&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

string ART::VerifyAndToStringInternal(const bool only_verify) {
	if (tree.HasMetadata()) {
		return "ART: " + tree.VerifyAndToString(*this, only_verify);
	}
	return "[empty]";
}